

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O1

int __thiscall QFactoryLoader::indexOf(QFactoryLoader *this,QString *needle)

{
  QCborContainerPrivate *pQVar1;
  int iVar2;
  qsizetype qVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QString local_98;
  QString local_80;
  QCborValueConstRef local_68;
  QArrayDataPointer<QCborArray> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QCborArray *)&DAT_aaaaaaaaaaaaaaaa;
  metaDataKeys((QList<QCborArray> *)&local_58,this);
  uVar5 = 0xffffffff;
  iVar2 = -1;
  if (0 < (int)local_58.size) {
    uVar4 = 0;
    do {
      pQVar1 = local_58.ptr[uVar4].d.d.ptr;
      qVar3 = QCborArray::size(local_58.ptr + uVar4);
      bVar7 = qVar3 == 0;
      if (!bVar7) {
        lVar6 = 0;
        do {
          local_98.d.d = (Data *)0x0;
          local_98.d.ptr = (char16_t *)0x0;
          local_98.d.size = 0;
          local_68.d = pQVar1;
          local_68.i = lVar6;
          QCborValueConstRef::toString(&local_80,&local_68,&local_98);
          iVar2 = QString::compare(&local_80,needle,CaseInsensitive);
          if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (iVar2 == 0) {
            uVar5 = uVar4 & 0xffffffff;
            break;
          }
          lVar6 = lVar6 + 1;
          bVar7 = qVar3 == lVar6;
        } while (!bVar7);
      }
      iVar2 = (int)uVar5;
      if (!bVar7) goto LAB_002d96bb;
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)(int)local_58.size);
    iVar2 = -1;
  }
LAB_002d96bb:
  QArrayDataPointer<QCborArray>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QFactoryLoader::indexOf(const QString &needle) const
{
    const QList<QCborArray> metaDataList = metaDataKeys();
    for (int i = 0; i < int(metaDataList.size()); ++i) {
        const QCborArray &keys = metaDataList[i];
        for (QCborValueConstRef key : keys) {
            if (key.toString().compare(needle, Qt::CaseInsensitive) == 0)
                return i;
        }
    }
    return -1;
}